

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O1

BOOL CONTEXT_GetThreadContext(DWORD dwProcessId,pthread_t self,LPCONTEXT lpContext)

{
  DWORD DVar1;
  pthread_t pVar2;
  BOOL BVar3;
  
  if (lpContext == (LPCONTEXT)0x0) {
    if (!PAL_InitializeChakraCoreCalled) goto LAB_0034dac5;
    SetLastError(0x3e6);
    BVar3 = 0;
  }
  else {
    DVar1 = GetCurrentProcessId();
    if ((DVar1 == dwProcessId) && (pVar2 = pthread_self(), pVar2 != self)) {
      if (PAL_InitializeChakraCoreCalled != false) {
        DVar1 = lpContext->ContextFlags;
        memset(lpContext,0,0x4d0);
        lpContext->ContextFlags = DVar1;
        return 1;
      }
LAB_0034dac5:
      abort();
    }
    BVar3 = 1;
    if ((lpContext->ContextFlags & 3) != 0) {
      CONTEXT_GetRegisters(dwProcessId,lpContext);
    }
  }
  return BVar3;
}

Assistant:

BOOL
CONTEXT_GetThreadContext(
         DWORD dwProcessId,
         pthread_t self,
         LPCONTEXT lpContext)
{
    BOOL ret = FALSE;

    if (lpContext == NULL)
    {
        ERROR("Invalid lpContext parameter value\n");
        SetLastError(ERROR_NOACCESS);
        goto EXIT;
    }

    /* How to consider the case when self is different from the current
       thread of its owner process. Machine registers values could be retrieved
       by a ptrace(pid, ...) call or from the "/proc/%pid/reg" file content.
       Unfortunately, these two methods only depend on process ID, not on
       thread ID. */

    if (dwProcessId == GetCurrentProcessId())
    {
        if (self != pthread_self())
        {
            DWORD flags;
            // There aren't any APIs for this. We can potentially get the
            // context of another thread by using per-thread signals, but
            // on FreeBSD signal handlers that are called as a result
            // of signals raised via pthread_kill don't get a valid
            // sigcontext or ucontext_t. But we need this to return TRUE
            // to avoid an assertion in the CLR in code that manages to
            // cope reasonably well without a valid thread context.
            // Given that, we'll zero out our structure and return TRUE.
            ERROR("GetThreadContext on a thread other than the current "
                  "thread is returning TRUE\n");
            flags = lpContext->ContextFlags;
            memset(lpContext, 0, sizeof(*lpContext));
            lpContext->ContextFlags = flags;
            ret = TRUE;
            goto EXIT;
        }

    }

    if (lpContext->ContextFlags &
        (CONTEXT_CONTROL | CONTEXT_INTEGER) & CONTEXT_AREA_MASK)
    {
        if (CONTEXT_GetRegisters(dwProcessId, lpContext) == FALSE)
        {
            SetLastError(ERROR_INTERNAL_ERROR);
            goto EXIT;
        }
    }

    ret = TRUE;

EXIT:
    return ret;
}